

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int match_tzname(date_parse_result *res,char **str,size_t *len)

{
  char cVar1;
  char *name;
  date_parse_result *pdVar2;
  int iVar3;
  size_t sVar4;
  CVmTimeZone *pCVar5;
  size_t len_00;
  char *pcVar6;
  size_t sVar7;
  int32_t tzofs;
  int local_44;
  char *local_40;
  date_parse_result *local_38;
  
  sVar7 = *len;
  if (sVar7 != 0) {
    name = *str;
    iVar3 = isalpha((int)*name);
    if (iVar3 != 0) {
      local_40 = name + sVar7;
      pcVar6 = name;
      local_38 = res;
      do {
        cVar1 = *pcVar6;
        iVar3 = isalpha((int)cVar1);
        if (iVar3 == 0) {
          if (cVar1 == '_') {
            if (sVar7 == 1) goto LAB_0028d128;
          }
          else if ((sVar7 == 1) || (cVar1 != '/')) goto LAB_0028d128;
          iVar3 = isalpha((int)pcVar6[1]);
          if (iVar3 == 0) goto LAB_0028d128;
        }
        pcVar6 = pcVar6 + 1;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
      sVar7 = 0;
      pcVar6 = local_40;
LAB_0028d128:
      pdVar2 = local_38;
      len_00 = (long)pcVar6 - (long)name;
      if (len_00 != 0) {
        sVar4 = 0;
        do {
          if (name[sVar4] == '\0') break;
          if (name[sVar4] == '/') {
            pCVar5 = CVmTimeZoneCache::get_db_zone(G_tzcache_X,name,len_00);
            if (pCVar5 != (CVmTimeZone *)0x0) {
              (pdVar2->ptz).p = *str;
              (pdVar2->ptz).len = (long)pcVar6 - (long)*str;
              *str = pcVar6;
              *len = sVar7;
              pdVar2->tz = pCVar5;
              return 1;
            }
            break;
          }
          sVar4 = sVar4 + 1;
        } while (len_00 != sVar4);
      }
      pCVar5 = CVmTimeZoneCache::get_zone_by_abbr
                         (G_tzcache_X,&local_44,*str,(long)pcVar6 - (long)*str);
      if (pCVar5 != (CVmTimeZone *)0x0) {
        (pdVar2->ptz).p = *str;
        (pdVar2->ptz).len = (long)pcVar6 - (long)*str;
        *str = pcVar6;
        *len = sVar7;
        pdVar2->tz = pCVar5;
        pdVar2->tzofs = local_44;
        if (pCVar5 != (CVmTimeZone *)0x0) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int match_tzname(VMG_ date_parse_result *res,
                        const char *&str, size_t &len)
{
    /* check for a zone name string ("America/Los_Angeles", etc) */
    if (len != 0 && isalpha(*str))
    {
        const char *p = str;
        size_t rem = len;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* allow letters, or / or _ if followed by a letter */
            if (isalpha(*p)
                || ((*p == '_' || *p == '/')
                    && rem > 1 && isalpha(p[1])))
                continue;

            /* otherwise we're done */
            break;
        }

        /* if it contains a slash, look up the zoneinfo database name */
        CVmTimeZone *tz = 0;
        if (lib_strnchr(str, p - str, '/') != 0)
        {
            if ((tz = G_tzcache->get_db_zone(vmg_ str, p - str)) != 0)
            {
                /* success - this is a valid timezone name */
                res->ptz.p = str;
                res->ptz.len = p - str;
                str = p;
                len = rem;
                res->tz = tz;
                return TRUE;
            }
        }

        /* didn't find a zone name; try an abbreviation */
        int32_t tzofs;
        tz = G_tzcache->get_zone_by_abbr(vmg_ &tzofs, str, p - str);
        if (tz != 0)
        {
            /* 
             *   Success - we found an abbreviation; this usually gives us
             *   both a timezone and a specific offset, since an abbreviation
             *   is specific to standard or daylight time.  However, some
             *   abbreviations don't specify an offset, since they're used in
             *   the same zone for both standard and daylight time (e.g.,
             *   Australian EST); these are flagged by tzofs coming back as
             *   INT32MINVAL.
             */
            res->ptz.p = str;
            res->ptz.len = p - str;
            str = p;
            len = rem;
            res->tz = tz;
            if (tzofs != INT32MINVAL)
                res->tzofs = tzofs;
            return TRUE;
        }
    }

    /* not a time zone */
    return FALSE;
}